

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O2

void __thiscall icu_63::NativeItem::setItem(NativeItem *this,Item *item,UDataSwapFn *swap)

{
  int iVar1;
  Item *pIVar2;
  char *pcVar3;
  FILE *__stream;
  int iVar4;
  UDataInfo *pUVar5;
  UDataSwapper *ds;
  uint8_t *puVar6;
  char *pcVar7;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  int32_t infoLength;
  
  this->pItem = item;
  errorCode = U_ZERO_ERROR;
  pUVar5 = getDataInfo(item->data,item->length,&infoLength,&itemHeaderLength,&errorCode);
  this->pInfo = pUVar5;
  if (U_ZERO_ERROR < errorCode) {
    exit(errorCode);
  }
  this->length = this->pItem->length - itemHeaderLength;
  if (pUVar5->isBigEndian == '\0' && pUVar5->charsetFamily == '\0') {
    this->bytes = this->pItem->data + itemHeaderLength;
  }
  else {
    ds = udata_openSwapper_63(pUVar5->isBigEndian,pUVar5->charsetFamily,'\0','\0',&errorCode);
    __stream = _stderr;
    if (U_ZERO_ERROR < errorCode) {
      pcVar3 = this->pItem->name;
      pcVar7 = u_errorName_63(errorCode);
      fprintf(__stream,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",pcVar3,pcVar7);
      exit(errorCode);
    }
    ds->printError = printError;
    ds->printErrorContext = _stderr;
    pIVar2 = this->pItem;
    iVar1 = pIVar2->length;
    iVar4 = -1;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    puVar6 = (uint8_t *)operator_new__((long)iVar4);
    this->swapped = puVar6;
    (*swap)(ds,pIVar2->data,iVar1,puVar6,&errorCode);
    pUVar5 = getDataInfo(this->swapped,this->pItem->length,&infoLength,&itemHeaderLength,&errorCode)
    ;
    this->pInfo = pUVar5;
    this->bytes = this->swapped + itemHeaderLength;
    udata_closeSwapper_63(ds);
  }
  return;
}

Assistant:

void setItem(const Item *item, UDataSwapFn *swap) {
        pItem=item;
        int32_t infoLength, itemHeaderLength;
        UErrorCode errorCode=U_ZERO_ERROR;
        pInfo=::getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
        if(U_FAILURE(errorCode)) {
            exit(errorCode); // should succeed because readFile() checks headers
        }
        length=pItem->length-itemHeaderLength;

        if(pInfo->isBigEndian==U_IS_BIG_ENDIAN && pInfo->charsetFamily==U_CHARSET_FAMILY) {
            bytes=pItem->data+itemHeaderLength;
        } else {
            UDataSwapper *ds=udata_openSwapper((UBool)pInfo->isBigEndian, pInfo->charsetFamily, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
            if(U_FAILURE(errorCode)) {
                fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                        pItem->name, u_errorName(errorCode));
                exit(errorCode);
            }

            ds->printError=printError;
            ds->printErrorContext=stderr;

            swapped=new uint8_t[pItem->length];
            if(swapped==NULL) {
                fprintf(stderr, "icupkg: unable to allocate memory for swapping \"%s\"\n", pItem->name);
                exit(U_MEMORY_ALLOCATION_ERROR);
            }
            swap(ds, pItem->data, pItem->length, swapped, &errorCode);
            pInfo=::getDataInfo(swapped, pItem->length, infoLength, itemHeaderLength, &errorCode);
            bytes=swapped+itemHeaderLength;
            udata_closeSwapper(ds);
        }
    }